

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

bool __thiscall pbrt::Image::HasAnyInfinitePixels(Image *this)

{
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar1;
  int iVar2;
  int *in_RDI;
  int c;
  int x;
  int y;
  WrapMode2D in_stack_00000044;
  Point2i in_stack_0000004c;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int iVar3;
  WrapMode2D *in_stack_ffffffffffffffd0;
  int local_1c;
  int local_18;
  int local_14;
  
  if (*in_RDI != 0) {
    for (local_14 = 0; local_14 < in_RDI[2]; local_14 = local_14 + 1) {
      for (local_18 = 0; local_18 < in_RDI[1]; local_18 = local_18 + 1) {
        local_1c = 0;
        while (iVar3 = local_1c, iVar2 = NChannels((Image *)0x53d560), iVar3 < iVar2) {
          Point2<int>::Point2((Point2<int> *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
          in_stack_ffffffffffffffc0 = local_1c;
          WrapMode2D::WrapMode2D(in_stack_ffffffffffffffd0,(WrapMode)((ulong)in_RDI >> 0x20));
          GetChannel(this,in_stack_0000004c,y,in_stack_00000044);
          eVar1 = IsInf<float>(0.0);
          if (eVar1) {
            return true;
          }
          local_1c = local_1c + 1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Image::HasAnyInfinitePixels() const {
    if (format == PixelFormat::U256)
        return false;

    for (int y = 0; y < resolution.y; ++y)
        for (int x = 0; x < resolution.x; ++x)
            for (int c = 0; c < NChannels(); ++c)
                if (IsInf(GetChannel({x, y}, c)))
                    return true;
    return false;
}